

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O2

void set_ivar(ixgbe_device *dev,int8_t direction,int8_t queue,int8_t msix_vector)

{
  uint uVar1;
  int iVar2;
  undefined7 in_register_00000031;
  ulong uVar3;
  
  iVar2 = (int)CONCAT71(in_register_00000031,direction);
  uVar1 = iVar2 << 4;
  uVar3 = (long)(iVar2 * 2) & 0xfffffffffffffffc;
  *(uint *)(dev->addr + uVar3 + 0x900) =
       (int)(char)(queue | 0x80) << (uVar1 & 0x1f) |
       ~(0xff << (uVar1 & 0x1f)) & *(uint *)(dev->addr + uVar3 + 0x900);
  return;
}

Assistant:

static void set_ivar(struct ixgbe_device* dev, int8_t direction, int8_t queue, int8_t msix_vector) {
	u32 ivar, index;
	msix_vector |= IXGBE_IVAR_ALLOC_VAL;
	index = ((16 * (queue & 1)) + (8 * direction));
	ivar = get_reg32(dev->addr, IXGBE_IVAR(queue >> 1));
	ivar &= ~(0xFF << index);
	ivar |= (msix_vector << index);
	set_reg32(dev->addr, IXGBE_IVAR(queue >> 1), ivar);
}